

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void __thiscall
QtPromisePrivate::PromiseDataBase<QString,_void_(const_QString_&)>::dispatch
          (PromiseDataBase<QString,_void_(const_QString_&)> *this)

{
  Data *pDVar1;
  bool bVar2;
  char cVar3;
  iterator iVar4;
  iterator iVar5;
  QObject *pQVar6;
  QEvent *this_00;
  PromiseError error;
  QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
  local_98;
  Data *local_78;
  pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *ppStack_70;
  qsizetype local_68;
  type local_58;
  
  bVar2 = isPending(this);
  if (!bVar2) {
    QReadWriteLock::lockForWrite();
    local_78 = (this->m_handlers).d.d;
    ppStack_70 = (this->m_handlers).d.ptr;
    local_68 = (this->m_handlers).d.size;
    (this->m_handlers).d.d = (Data *)0x0;
    (this->m_handlers).d.ptr = (pair<QPointer<QThread>,_std::function<void_(const_int_&)>_> *)0x0;
    (this->m_handlers).d.size = 0;
    local_98.d = (this->m_catchers).d.d;
    local_98.ptr = (this->m_catchers).d.ptr;
    local_98.size = (this->m_catchers).d.size;
    (this->m_catchers).d.d = (Data *)0x0;
    (this->m_catchers).d.ptr =
         (pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_> *)
         0x0;
    (this->m_catchers).d.size = 0;
    QReadWriteLock::unlock();
    bVar2 = PromiseError::isNull(&this->m_error);
    if (bVar2) {
      (*this->_vptr_PromiseDataBase[2])(this,&local_78);
    }
    else {
      std::__exception_ptr::exception_ptr::exception_ptr(&error.m_data,&(this->m_error).m_data);
      iVar4 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
              ::begin((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                       *)&local_98);
      iVar5 = QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
              ::end((QList<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
                     *)&local_98);
      for (; iVar4.i != iVar5.i; iVar4.i = iVar4.i + 1) {
        std::function<void_(const_QtPromisePrivate::PromiseError_&)>::function
                  (&local_58.fn,&(iVar4.i)->second);
        std::__exception_ptr::exception_ptr::exception_ptr(&local_58.error.m_data,&error.m_data);
        pDVar1 = ((iVar4.i)->first).wp.d;
        if ((pDVar1 != (Data *)0x0) &&
           (((iVar4.i)->first).wp.value != (QObject *)0x0 &&
            (pDVar1->strongref)._q_value.super___atomic_base<int>._M_i != 0)) {
          cVar3 = QThread::isFinished();
          if (cVar3 == '\0') {
            pDVar1 = ((iVar4.i)->first).wp.d;
            if ((pDVar1 == (Data *)0x0) ||
               ((pDVar1->strongref)._q_value.super___atomic_base<int>._M_i == 0)) {
              pQVar6 = (QObject *)0x0;
            }
            else {
              pQVar6 = ((iVar4.i)->first).wp.value;
            }
            pQVar6 = (QObject *)QAbstractEventDispatcher::instance((QThread *)pQVar6);
            if (pQVar6 == (QObject *)0x0) {
              cVar3 = QCoreApplication::closingDown();
              if (cVar3 != '\0') goto LAB_001103ad;
            }
            this_00 = (QEvent *)operator_new(0x38);
            QEvent::QEvent(this_00,None);
            *(undefined ***)this_00 = &PTR__Event_00127478;
            PromiseDataBase<QString,void(QString_const&)>::dispatch()::{lambda()#1}::dispatch
                      ((_lambda___1_ *)(this_00 + 0x10),&local_58);
            QCoreApplication::postEvent(pQVar6,this_00,0);
          }
        }
LAB_001103ad:
        PromiseDataBase<QString,void(QString_const&)>::dispatch()::{lambda()#1}::~dispatch
                  ((_lambda___1_ *)&local_58);
      }
      std::__exception_ptr::exception_ptr::~exception_ptr(&error.m_data);
    }
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QtPromisePrivate::PromiseError_&)>_>_>
    ::~QArrayDataPointer(&local_98);
    QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_>_>::
    ~QArrayDataPointer((QArrayDataPointer<std::pair<QPointer<QThread>,_std::function<void_(const_QString_&)>_>_>
                        *)&local_78);
  }
  return;
}

Assistant:

void dispatch()
    {
        if (isPending()) {
            return;
        }

        // A promise can't be resolved multiple times so once settled, its state can't
        // change. When fulfilled, handlers must be called (a single time) and catchers
        // ignored indefinitely (or vice-versa when the promise is rejected), so make
        // sure to clear both handlers AND catchers when dispatching. This also prevents
        // shared pointer circular reference memory leaks when the owning promise is
        // captured in the handler and/or catcher lambdas.

        m_lock.lockForWrite();
        QVector<Handler> handlers = std::move(m_handlers);
        QVector<Catcher> catchers = std::move(m_catchers);
        m_lock.unlock();

        if (m_error.isNull()) {
            notify(handlers);
            return;
        }

        PromiseError error = m_error;
        Q_ASSERT(!error.isNull());

        for (const auto& catcher : catchers) {
            const auto& fn = catcher.second;
            qtpromise_defer(
                [=]() {
                    fn(error);
                },
                catcher.first);
        }
    }